

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O2

void __thiscall bandit::reporter::xunit::print_remaining_header_with_time(xunit *this)

{
  long lVar1;
  ostream *poVar2;
  string local_30;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar1 = lVar1 - (this->testcase_start_time_point_).__d.__r;
  (this->testsuite_runtime_).__r = (this->testsuite_runtime_).__r + lVar1;
  poVar2 = std::operator<<((ostream *)&this->field_0x80," time=\"");
  std::__cxx11::to_string(&local_30,(double)lVar1 / 1000000000.0);
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  std::operator<<(poVar2,"\">\n");
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void print_remaining_header_with_time() {
        auto dur = std::chrono::high_resolution_clock::now() - testcase_start_time_point_;
        testsuite_runtime_ += std::chrono::duration_cast<std::chrono::nanoseconds>(dur);
        std::chrono::duration<double> dur_in_sec(dur);
        work_stm_ << " time=\"" << std::to_string(dur_in_sec.count()) << "\">\n";
      }